

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpegd_rkv.c
# Opt level: O0

MPP_RET jpegd_write_rkv_htbl(JpegdHalCtx *ctx,JpegdSyntax *jpegd_syntax)

{
  int iVar1;
  long lVar2;
  long lVar3;
  void *pvVar4;
  RK_U8 *data;
  DcTable *dc_ptr;
  AcTable *ac_ptr;
  int local_1e0;
  RK_U32 len;
  RK_S32 addr;
  RK_U16 code;
  RK_U8 htbl_value [192];
  RK_U16 acc_addr_dc [16];
  RK_U16 acc_addr_ac [16];
  RK_U16 min_code_dc [16];
  RK_U16 min_code_ac [16];
  RK_U16 *p_htbl_mincode;
  RK_U8 *p_htbl_value;
  uint local_80;
  RK_U32 k;
  RK_U32 j;
  RK_U32 i;
  void *htbl_ptr [6];
  JpegdSyntax *s;
  MPP_RET ret;
  JpegdSyntax *jpegd_syntax_local;
  JpegdHalCtx *ctx_local;
  
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpegd_rkv","enter\n","jpegd_write_rkv_htbl");
  }
  memset(&j,0,0x30);
  pvVar4 = mpp_buffer_get_ptr_with_caller(ctx->pTableBase,"jpegd_write_rkv_htbl");
  p_htbl_mincode = (RK_U16 *)((long)pvVar4 + 0x2c0);
  pvVar4 = mpp_buffer_get_ptr_with_caller(ctx->pTableBase,"jpegd_write_rkv_htbl");
  min_code_ac._24_8_ = (long)pvVar4 + 0x180;
  memset(min_code_dc + 0xc,0,0x20);
  memset(acc_addr_ac + 0xc,0,0x20);
  memset(acc_addr_dc + 0xc,0,0x20);
  memset(htbl_value + 0xb8,0,0x20);
  memset(&addr,0,0xc0);
  _j = jpegd_syntax->dc_table + jpegd_syntax->dc_index[0];
  htbl_ptr[0] = jpegd_syntax->ac_table + jpegd_syntax->ac_index[0];
  htbl_ptr[1] = jpegd_syntax->dc_table + jpegd_syntax->dc_index[1];
  htbl_ptr[2] = jpegd_syntax->ac_table + jpegd_syntax->ac_index[1];
  htbl_ptr[3] = jpegd_syntax->dc_table + jpegd_syntax->dc_index[1];
  htbl_ptr[4] = jpegd_syntax->ac_table + jpegd_syntax->ac_index[1];
  for (p_htbl_value._4_4_ = 0; p_htbl_value._4_4_ < jpegd_syntax->nb_components;
      p_htbl_value._4_4_ = p_htbl_value._4_4_ + 1) {
    lVar2 = *(long *)(&j + (ulong)(p_htbl_value._4_4_ << 1) * 2);
    lVar3 = *(long *)(&j + (ulong)(p_htbl_value._4_4_ * 2 + 1) * 2);
    local_1e0 = 0;
    len._2_2_ = 0;
    acc_addr_ac[0xc] = 0;
    htbl_value[0xb8] = '\0';
    htbl_value[0xb9] = '\0';
    for (local_80 = 0; local_80 < 0x10; local_80 = local_80 + 1) {
      iVar1 = *(int *)(lVar2 + (ulong)local_80 * 4);
      if ((iVar1 == 0) && (local_80 != 0)) {
        if ((uint)acc_addr_ac[(ulong)(local_80 - 1) + 0xc] * 2 < (uint)len._2_2_) {
          acc_addr_ac[(ulong)local_80 + 0xc] = len._2_2_;
        }
        else {
          acc_addr_ac[(ulong)local_80 + 0xc] = acc_addr_ac[(ulong)(local_80 - 1) + 0xc] << 1;
        }
      }
      else {
        acc_addr_ac[(ulong)local_80 + 0xc] = len._2_2_;
      }
      local_1e0 = iVar1 + local_1e0;
      acc_addr_dc[(ulong)local_80 - 4] = (RK_U16)local_1e0;
      len._2_2_ = (len._2_2_ + (short)iVar1) * 2;
    }
    if (*(int *)(lVar2 + 0x3c) == 0) {
      acc_addr_ac[0xc] = min_code_dc[0xb];
    }
    else {
      acc_addr_ac[0xc] = (min_code_dc[0xb] + (short)*(undefined4 *)(lVar2 + 0x3c)) - 1;
    }
    local_1e0 = 0;
    len._2_2_ = 0;
    min_code_dc[0xc] = 0;
    acc_addr_dc[0xc] = 0;
    for (local_80 = 0; local_80 < 0x10; local_80 = local_80 + 1) {
      iVar1 = *(int *)(lVar3 + (ulong)local_80 * 4);
      if ((iVar1 == 0) && (local_80 != 0)) {
        if ((uint)min_code_dc[(ulong)(local_80 - 1) + 0xc] * 2 < (uint)len._2_2_) {
          min_code_dc[(ulong)local_80 + 0xc] = len._2_2_;
        }
        else {
          min_code_dc[(ulong)local_80 + 0xc] = min_code_dc[(ulong)(local_80 - 1) + 0xc] << 1;
        }
      }
      else {
        min_code_dc[(ulong)local_80 + 0xc] = len._2_2_;
      }
      local_1e0 = iVar1 + local_1e0;
      acc_addr_dc[(ulong)local_80 + 0xc] = (RK_U16)local_1e0;
      len._2_2_ = (len._2_2_ + (short)iVar1) * 2;
    }
    if (*(int *)(lVar3 + 0x3c) == 0) {
      min_code_dc[0xc] = min_code_ac[0xb];
    }
    else {
      min_code_dc[0xc] = (min_code_ac[0xb] + (short)*(undefined4 *)(lVar3 + 0x3c)) - 1;
    }
    for (k = 0; k < 0x10; k = k + 1) {
      *(RK_U16 *)min_code_ac._24_8_ = acc_addr_ac[(ulong)k + 0xc];
      min_code_ac._24_8_ = min_code_ac._24_8_ + 2;
    }
    for (k = 0; k < 8; k = k + 1) {
      *(RK_U16 *)min_code_ac._24_8_ =
           acc_addr_dc[(ulong)(k << 1) - 4] | acc_addr_dc[(ulong)(k * 2 + 1) - 4] << 8;
      min_code_ac._24_8_ = min_code_ac._24_8_ + 2;
    }
    for (k = 0; k < 0x10; k = k + 1) {
      *(RK_U16 *)min_code_ac._24_8_ = min_code_dc[(ulong)k + 0xc];
      min_code_ac._24_8_ = min_code_ac._24_8_ + 2;
    }
    for (k = 0; k < 8; k = k + 1) {
      *(RK_U16 *)min_code_ac._24_8_ =
           acc_addr_dc[(ulong)(k << 1) + 0xc] | acc_addr_dc[(ulong)(k * 2 + 1) + 0xc] << 8;
      min_code_ac._24_8_ = min_code_ac._24_8_ + 2;
    }
    for (k = 0; k < 0xc; k = k + 1) {
      *(char *)((long)&addr + (ulong)k) = (char)*(undefined4 *)(lVar2 + 0x40 + (ulong)k * 4);
    }
    for (k = 0; k < 0xa2; k = k + 1) {
      *(char *)((long)&addr + (ulong)(k + 0x10)) =
           (char)*(undefined4 *)(lVar3 + 0x40 + (ulong)k * 4);
    }
    for (k = 0; k < 0xc0; k = k + 1) {
      *(undefined1 *)p_htbl_mincode = *(undefined1 *)((long)&addr + (ulong)k);
      p_htbl_mincode = (RK_U16 *)((long)p_htbl_mincode + 1);
    }
  }
  if ((jpegd_debug & 0x100) != 0) {
    pvVar4 = mpp_buffer_get_ptr_with_caller(ctx->pTableBase,"jpegd_write_rkv_htbl");
    _mpp_log_l(4,"hal_jpegd_rkv","--------------huffman value tbl----------------------\n",
               (char *)0x0);
    for (k = 0; k < 0x240; k = k + 8) {
      _mpp_log_l(4,"hal_jpegd_rkv","%02x%02x%02x%02x%02x%02x%02x%02x\n",(char *)0x0,
                 (ulong)*(byte *)((long)pvVar4 + (ulong)(k + 7) + 0x2c0),
                 (ulong)*(byte *)((long)pvVar4 + (ulong)(k + 6) + 0x2c0),
                 (uint)*(byte *)((long)pvVar4 + (ulong)(k + 5) + 0x2c0),
                 (uint)*(byte *)((long)pvVar4 + (ulong)(k + 4) + 0x2c0),
                 (uint)*(byte *)((long)pvVar4 + (ulong)(k + 3) + 0x2c0),
                 (uint)*(byte *)((long)pvVar4 + (ulong)(k + 2) + 0x2c0),
                 (uint)*(byte *)((long)pvVar4 + (ulong)(k + 1) + 0x2c0),
                 (uint)*(byte *)((long)pvVar4 + (ulong)k + 0x2c0));
    }
    pvVar4 = mpp_buffer_get_ptr_with_caller(ctx->pTableBase,"jpegd_write_rkv_htbl");
    _mpp_log_l(4,"hal_jpegd_rkv","--------------huffman mincode tbl----------------------\n",
               (char *)0x0);
    for (k = 0; k < 0x120; k = k + 8) {
      _mpp_log_l(4,"hal_jpegd_rkv","%02x%02x%02x%02x%02x%02x%02x%02x\n",(char *)0x0,
                 (ulong)*(byte *)((long)pvVar4 + (ulong)(k + 7) + 0x180),
                 (ulong)*(byte *)((long)pvVar4 + (ulong)(k + 6) + 0x180),
                 (uint)*(byte *)((long)pvVar4 + (ulong)(k + 5) + 0x180),
                 (uint)*(byte *)((long)pvVar4 + (ulong)(k + 4) + 0x180),
                 (uint)*(byte *)((long)pvVar4 + (ulong)(k + 3) + 0x180),
                 (uint)*(byte *)((long)pvVar4 + (ulong)(k + 2) + 0x180),
                 (uint)*(byte *)((long)pvVar4 + (ulong)(k + 1) + 0x180),
                 (uint)*(byte *)((long)pvVar4 + (ulong)k + 0x180));
    }
  }
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpegd_rkv","exit\n","jpegd_write_rkv_htbl");
  }
  return MPP_OK;
}

Assistant:

MPP_RET jpegd_write_rkv_htbl(JpegdHalCtx *ctx, JpegdSyntax *jpegd_syntax)
{
    jpegd_dbg_func("enter\n");
    MPP_RET ret = MPP_OK;

    JpegdSyntax *s = jpegd_syntax;
    void * htbl_ptr[6] = {NULL};
    RK_U32 i, j, k = 0;
    RK_U8 *p_htbl_value = (RK_U8 *)mpp_buffer_get_ptr(ctx->pTableBase) + RKD_HUFFMAN_VALUE_TBL_OFFSET;
    RK_U16 *p_htbl_mincode = (RK_U16 *)mpp_buffer_get_ptr(ctx->pTableBase) + RKD_HUFFMAN_MINCODE_TBL_OFFSET  / 2;
    RK_U16 min_code_ac[16] = {0};
    RK_U16 min_code_dc[16] = {0};
    RK_U16 acc_addr_ac[16] = {0};
    RK_U16 acc_addr_dc[16] = {0};
    RK_U8 htbl_value[192] = {0};
    RK_U16 code = 0;
    RK_S32 addr = 0;
    RK_U32 len = 0;
    AcTable *ac_ptr;
    DcTable *dc_ptr;

    htbl_ptr[0] = &s->dc_table[s->dc_index[0]];
    htbl_ptr[1] = &s->ac_table[s->ac_index[0]];

    htbl_ptr[2] = &s->dc_table[s->dc_index[1]];
    htbl_ptr[3] = &s->ac_table[s->ac_index[1]];

    htbl_ptr[4] = htbl_ptr[2];
    htbl_ptr[5] = htbl_ptr[3];

    for (k = 0; k < s->nb_components; k++) {
        dc_ptr = (DcTable *)htbl_ptr[k * 2];
        ac_ptr = (AcTable *)htbl_ptr[k * 2 + 1];

        len = dc_ptr->bits[0];
        code = addr = 0;
        min_code_dc[0] = 0;
        acc_addr_dc[0] = 0;

        for (j = 0; j < 16; j++) {
            len = dc_ptr->bits[j];

            if (len == 0 && j > 0) {
                if (code > (min_code_dc[j - 1] << 1))
                    min_code_dc[j] = code;
                else
                    min_code_dc[j] = min_code_dc[j - 1] << 1;
            } else {
                min_code_dc[j] = code;
            }

            code += len;
            addr += len;
            acc_addr_dc[j] = addr;
            code <<= 1;

        }

        if (dc_ptr->bits[15])
            min_code_dc[0] = min_code_dc[15] + dc_ptr->bits[15] - 1;
        else
            min_code_dc[0] = min_code_dc[15];

        len = ac_ptr->bits[0];
        code = addr = 0;
        min_code_ac[0] = 0;
        acc_addr_ac[0] = 0;
        for (j = 0; j < 16; j++) {
            len = ac_ptr->bits[j];

            if (len == 0 && j > 0) {
                if (code > (min_code_ac[j - 1] << 1))
                    min_code_ac[j] = code;
                else
                    min_code_ac[j] = min_code_ac[j - 1] << 1;
            } else {
                min_code_ac[j] = code;
            }

            code += len;
            addr += len;
            acc_addr_ac[j] = addr;
            code <<= 1;
        }

        if (ac_ptr->bits[15])
            min_code_ac[0] = min_code_ac[15] + ac_ptr->bits[15] - 1;
        else
            min_code_ac[0] = min_code_ac[15];

        for (i = 0; i < 16; i++) {
            *p_htbl_mincode++ = min_code_dc[i];
        }

        for (i = 0; i < 8; i++) {
            *p_htbl_mincode++ = acc_addr_dc[2 * i] | acc_addr_dc[2 * i + 1] << 8;
        }

        for (i = 0; i < 16; i++) {
            *p_htbl_mincode++ = min_code_ac[i];
        }

        for (i = 0; i < 8; i++) {
            *p_htbl_mincode++ = acc_addr_ac[2 * i] | acc_addr_ac[2 * i + 1] << 8;
        }

        for (i = 0; i < MAX_DC_HUFFMAN_TABLE_LENGTH; i++) {
            htbl_value[i] = dc_ptr->vals[i];
        }

        for (i = 0; i < MAX_AC_HUFFMAN_TABLE_LENGTH; i++) {
            htbl_value[i + 16] = ac_ptr->vals[i];
        }

        for (i = 0; i < 12 * 16; i++) {
            *p_htbl_value++ = htbl_value[i];
        }
    }

    if (jpegd_debug & JPEGD_DBG_HAL_TBL) {
        RK_U8 *data = (RK_U8 *)mpp_buffer_get_ptr(ctx->pTableBase) + RKD_HUFFMAN_VALUE_TBL_OFFSET;

        mpp_log("--------------huffman value tbl----------------------\n");
        for (i = 0; i < RKD_HUFFMAN_VALUE_TBL_SIZE; i += 8) {
            mpp_log("%02x%02x%02x%02x%02x%02x%02x%02x\n",
                    data[i + 7], data[i + 6], data[i + 5], data[i + 4],
                    data[i + 3], data[i + 2], data[i + 1], data[i + 0]);
        }

        data = NULL;
        data = (RK_U8 *)mpp_buffer_get_ptr(ctx->pTableBase) + RKD_HUFFMAN_MINCODE_TBL_OFFSET;

        mpp_log("--------------huffman mincode tbl----------------------\n");
        for (i = 0; i < RKD_HUFFMAN_MINCODE_TBL_SIZE; i += 8) {
            mpp_log("%02x%02x%02x%02x%02x%02x%02x%02x\n",
                    data[i + 7], data[i + 6], data[i + 5], data[i + 4],
                    data[i + 3], data[i + 2], data[i + 1], data[i + 0]);
        }
    }

    jpegd_dbg_func("exit\n");
    return ret;
}